

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor,sqlite_int64 *pRowid)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  RtreeCursor *pCur;
  RtreeNode *pRVar4;
  i64 iVar5;
  i64 *in_RSI;
  RtreeCursor *in_RDI;
  long in_FS_OFFSET;
  RtreeNode *pNode;
  RtreeSearchPoint *p;
  RtreeCursor *pCsr;
  int rc;
  RtreeNode *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCur = (RtreeCursor *)rtreeSearchPointFirst(in_RDI);
  local_c = 0;
  pRVar4 = rtreeNodeOfFirstSearchPoint(pCur,in_stack_ffffffffffffffc8);
  if (pCur != (RtreeCursor *)0x0) {
    uVar2 = (uint)*(byte *)((long)&pCur->nConstraint + 2);
    iVar3 = readInt16(pRVar4->zData + 2);
    if ((int)uVar2 < iVar3) {
      iVar5 = nodeGetRowid((Rtree *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8,0);
      *in_RSI = iVar5;
    }
    else {
      local_c = 4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

static int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor, sqlite_int64 *pRowid){
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);
  if( rc==SQLITE_OK && ALWAYS(p) ){
    if( p->iCell>=NCELL(pNode) ){
      rc = SQLITE_ABORT;
    }else{
      *pRowid = nodeGetRowid(RTREE_OF_CURSOR(pCsr), pNode, p->iCell);
    }
  }
  return rc;
}